

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O0

void license::test_sign(parsed_options *parsed,variables_map *vm,char **argv,
                       options_description *global)

{
  bool bVar1;
  byte bVar2;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar3;
  options_description_easy_init *poVar4;
  pointer pCVar5;
  logic_error *this;
  ostream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  string local_398 [8];
  ofstream ofile;
  string local_198 [8];
  string signedData;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  string local_168;
  undefined8 local_148;
  undefined1 local_140 [8];
  string outputFile;
  string data;
  string private_key_file;
  allocator local_c9;
  string local_c8 [32];
  options_description local_a8 [8];
  options_description license_desc;
  options_description *global_local;
  char **argv_local;
  variables_map *vm_local;
  parsed_options *parsed_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"license issue options",&local_c9);
  boost::program_options::options_description::options_description(local_a8,local_c8,0x50,0x28);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::string((string *)(data.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(outputFile.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_140);
  local_148 = boost::program_options::options_description::add_options(local_a8);
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&outputFile.field_2 + 8));
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_148,"data,d",(value_semantic *)ptVar3,
                      "Data to be signed");
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)&data.field_2 + 8));
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar4,"primary-key,p",(value_semantic *)ptVar3,"Primary key location");
  ptVar3 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140
                     );
  ptVar3 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::required(ptVar3);
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"output,o",(value_semantic *)ptVar3,"file where to write output");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"license issue",
             (allocator *)
             ((long)&crypto._M_t.
                     super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>
                     .super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl + 7));
  rerunBoostPO(parsed,local_a8,vm,argv,&local_168,global);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&crypto._M_t.
                     super___uniq_ptr_impl<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_license::CryptoHelper_*,_std::default_delete<license::CryptoHelper>_>
                     .super__Head_base<0UL,_license::CryptoHelper_*,_false>._M_head_impl + 7));
  CryptoHelper::getInstance();
  pCVar5 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)((long)&signedData.field_2 + 8));
  (*pCVar5->_vptr_CryptoHelper[3])(pCVar5,(undefined1 *)((long)&data.field_2 + 8));
  pCVar5 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)((long)&signedData.field_2 + 8));
  (*pCVar5->_vptr_CryptoHelper[5])(local_198,pCVar5,(undefined1 *)((long)&outputFile.field_2 + 8));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_140,"cout");
  if (bVar1) {
    std::ofstream::ofstream(local_398);
    std::ofstream::open(local_398,(_Ios_Openmode)local_140);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_3d8,"can\'t create [",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
      ;
      std::operator+(&local_3b8,&local_3d8,"]");
      std::logic_error::logic_error(this,(string *)&local_3b8);
      __cxa_throw(this,std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::operator<<((ostream *)local_398,local_198);
    std::ofstream::close();
    std::ofstream::~ofstream(local_398);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,local_198);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_198);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             ((long)&signedData.field_2 + 8));
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)(outputFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(data.field_2._M_local_buf + 8));
  boost::program_options::options_description::~options_description(local_a8);
  return;
}

Assistant:

static void test_sign(const po::parsed_options &parsed, po::variables_map &vm, const char **argv,
					  const po::options_description &global) {
	po::options_description license_desc("license issue options");
	string private_key_file;
	string data;
	string outputFile;
	license_desc.add_options()  //
		("data,d", po::value<string>(&data)->required(), "Data to be signed")  //
		(PARAM_PRIMARY_KEY ",p", po::value<string>(&private_key_file)->required(), "Primary key location")  //
		("output,o", po::value<string>(&outputFile)->required(), "file where to write output");
	rerunBoostPO(parsed, license_desc, vm, argv, "license issue", global);
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->loadPrivateKey_file(private_key_file);
	string signedData(crypto->signString(data));
	if (outputFile != "cout") {
		ofstream ofile;
		ofile.open(outputFile, ios::trunc);
		if (!ofile.is_open()) {
			throw logic_error("can't create [" + outputFile + "]");
		}
		ofile << signedData;
		ofile.close();
	} else {
		cout << signedData << endl;
	}
}